

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

iter_type __thiscall
booster::locale::impl_icu::num_format<wchar_t>::do_real_put<long>
          (num_format<wchar_t> *this,iter_type out,ios_base *ios,char_type_conflict fill,long val)

{
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __first;
  bool bVar1;
  fmtflags __a;
  _Ios_Fmtflags _Var2;
  pointer pfVar3;
  streamsize sVar4;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *poVar5;
  ios_base *in_RCX;
  bool in_DL;
  undefined1 extraout_DL;
  undefined1 uVar6;
  undefined8 extraout_RDX;
  streambuf_type *in_RSI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> oVar7;
  iter_type iVar8;
  fmtflags flags;
  streamsize n;
  streamsize points;
  streamsize on_right;
  streamsize on_left;
  string_type *str;
  size_t code_points;
  formatter_ptr formatter;
  string *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  ios_base *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  long lVar9;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  in_stack_fffffffffffffec8;
  undefined6 in_stack_fffffffffffffed0;
  byte bVar10;
  long local_d0;
  long local_c8;
  wstring local_c0 [32];
  wstring *local_a0;
  long local_98;
  undefined4 local_8c;
  streambuf_type *local_88;
  undefined1 local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  bool bStack_70;
  undefined3 uStack_6f;
  undefined4 uStack_6c;
  byte local_61;
  undefined8 local_40;
  undefined4 local_34;
  ios_base *local_30;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> local_20;
  streambuf_type *local_10;
  undefined8 local_8;
  
  local_20._M_failed = in_DL;
  local_40 = in_R9;
  local_34 = in_R8D;
  local_30 = in_RCX;
  local_20._M_sbuf = in_RSI;
  std::
  unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,std::default_delete<booster::locale::impl_icu::formatter<wchar_t>>>
  ::unique_ptr<std::default_delete<booster::locale::impl_icu::formatter<wchar_t>>,void>
            ((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
              *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  local_61 = 0;
  bVar1 = num_base::use_parent<long>
                    (in_stack_fffffffffffffe88,
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  bVar10 = true;
  if (!bVar1) {
    formatter<wchar_t>::create
              (in_stack_fffffffffffffe88,
               (Locale *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78);
    local_61 = 1;
    std::
    unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
    ::operator=((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                (unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                 *)in_stack_fffffffffffffe78);
    pfVar3 = std::
             unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
             ::get((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    bVar10 = pfVar3 == (pointer)0x0;
  }
  uVar6 = bVar10;
  if ((local_61 & 1) != 0) {
    std::
    unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
    ::~unique_ptr((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  }
  if ((bVar10 & 1) == 0) {
    pfVar3 = std::
             unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
             ::operator->((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                           *)0x276616);
    (*(pfVar3->super_base_formatter)._vptr_base_formatter[3])(local_c0,pfVar3,local_40,&local_98);
    local_a0 = local_c0;
    local_c8 = 0;
    local_d0 = 0;
    lVar9 = local_98;
    sVar4 = std::ios_base::width(local_30);
    if (lVar9 < sVar4) {
      sVar4 = std::ios_base::width(local_30);
      __a = std::ios_base::flags(local_30);
      _Var2 = std::operator&(__a,_S_adjustfield);
      if (_Var2 != _S_left) {
        local_c8 = sVar4 - local_98;
      }
      local_d0 = (sVar4 - local_98) - local_c8;
    }
    for (; 0 < local_c8; local_c8 = local_c8 + -1) {
      poVar5 = std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator++
                         (&local_20,0);
      std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator*(poVar5);
      std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator=
                ((ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)
                 CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                 (wchar_t)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    }
    std::__cxx11::wstring::begin();
    std::__cxx11::wstring::end();
    __first._M_current._6_1_ = bVar10;
    __first._M_current._0_6_ = in_stack_fffffffffffffed0;
    __first._M_current._7_1_ = uVar6;
    oVar7._8_7_ = in_stack_fffffffffffffec0;
    oVar7._M_sbuf = (streambuf_type *)lVar9;
    oVar7._15_1_ = in_stack_fffffffffffffec7;
    oVar7 = std::
            copy<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>
                      (__first,in_stack_fffffffffffffec8,oVar7);
    uVar6 = oVar7._M_failed;
    for (; 0 < local_d0; local_d0 = local_d0 + -1) {
      in_stack_fffffffffffffe84 = local_34;
      poVar5 = std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator++
                         (&local_20,0);
      std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator*(poVar5);
      std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator=
                ((ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)
                 CONCAT17(uVar6,in_stack_fffffffffffffe90),(wchar_t)((ulong)poVar5 >> 0x20));
    }
    std::ios_base::width(local_30,0);
    local_10 = local_20._M_sbuf;
    local_8 = CONCAT44(local_20._12_4_,local_20._8_4_);
    local_8c = 1;
    std::__cxx11::wstring::~wstring(local_c0);
  }
  else {
    local_78 = local_20._M_sbuf._0_4_;
    uStack_74 = local_20._M_sbuf._4_4_;
    bStack_70 = local_20._M_failed;
    uStack_6f = local_20._9_3_;
    uStack_6c = local_20._12_4_;
    local_88 = (streambuf_type *)
               std::num_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::
               do_put(in_RDI,local_20._M_sbuf,local_20._8_4_,local_30,local_34,local_40);
    local_8 = CONCAT71(local_8._1_7_,extraout_DL);
    local_8c = 1;
    local_80 = extraout_DL;
    local_10 = local_88;
  }
  std::
  unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
  ::~unique_ptr((unique_ptr<booster::locale::impl_icu::formatter<wchar_t>,_std::default_delete<booster::locale::impl_icu::formatter<wchar_t>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  iVar8._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  iVar8._M_failed = (bool)(undefined1)local_8;
  iVar8._M_sbuf = local_10;
  return iVar8;
}

Assistant:

iter_type do_real_put (iter_type out, std::ios_base &ios, char_type fill, ValueType val) const
    {
        formatter_ptr formatter;
        
        if(use_parent<ValueType>(ios,val) || (formatter = formatter_type::create(ios,loc_,enc_)).get() == 0) {
            return std::num_put<char_type>::do_put(out,ios,fill,val);
        }
        
        size_t code_points;
        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type const &str = formatter->format(static_cast<cast_type>(val),code_points);
        std::streamsize on_left=0,on_right = 0,points = code_points;
        if(points < ios.width()) {
            std::streamsize n = ios.width() - points;
            
            std::ios_base::fmtflags flags = ios.flags() & std::ios_base::adjustfield;
            
            //
            // We do not really know internal point, so we assume that it does not
            // exist. So according to the standard field should be right aligned
            //
            if(flags != std::ios_base::left)
                on_left = n;
            on_right = n - on_left;
        }
        while(on_left > 0) {
            *out++ = fill;
            on_left--;
        }
        std::copy(str.begin(),str.end(),out);
        while(on_right > 0) {
            *out++ = fill;
            on_right--;
        }
        ios.width(0);
        return out;

    }